

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

TRef rec_upvalue(jit_State *J,uint32_t uv,TRef val)

{
  bool bVar1;
  ushort uVar2;
  int iVar3;
  TRef TVar4;
  GCupval *uvp_00;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint in_EDX;
  uint in_ESI;
  jit_State *in_RDI;
  TRef res;
  IRType t;
  int32_t slot;
  TRef kfunc;
  TRef tr;
  int needbarrier;
  IRRef uref;
  TRef fn;
  GCupval *uvp;
  undefined4 in_stack_fffffffffffffec8;
  int32_t in_stack_fffffffffffffecc;
  jit_State *in_stack_fffffffffffffed0;
  jit_State *pjVar8;
  undefined2 in_stack_fffffffffffffed8;
  IRRef1 in_stack_fffffffffffffeda;
  int32_t in_stack_fffffffffffffedc;
  cTValue *in_stack_fffffffffffffee0;
  undefined6 in_stack_fffffffffffffee8;
  undefined2 in_stack_fffffffffffffeee;
  IRRef1 IVar9;
  jit_State *in_stack_fffffffffffffef0;
  jit_State *pjVar10;
  TRef local_108;
  TRef local_ec;
  uint local_e0;
  TRef local_cc;
  uint local_c;
  
  uvp_00 = (GCupval *)(ulong)*(uint *)((long)in_RDI->fn + (ulong)in_ESI * 4 + 0x14);
  local_ec = getcurrf((jit_State *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  IVar9 = (IRRef1)local_ec;
  bVar1 = false;
  iVar3 = rec_upvalue_constify(in_RDI,uvp_00);
  local_ec._0_2_ = IVar9;
  if (iVar3 != 0) {
    if (0x7fff < (local_ec & 0xffff)) {
      if (0x5f < in_RDI->pt->flags) goto LAB_001a2482;
      local_ec = lj_ir_kgc(in_stack_fffffffffffffef0,
                           (GCobj *)CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8),
                           (IRType)((ulong)in_stack_fffffffffffffee0 >> 0x20));
      (in_RDI->fold).ins.field_0.ot = 0x888;
      (in_RDI->fold).ins.field_0.op1 = IVar9;
      (in_RDI->fold).ins.field_0.op2 = (IRRef1)local_ec;
      lj_opt_fold((jit_State *)
                  CONCAT44(in_stack_fffffffffffffedc,
                           CONCAT22(in_stack_fffffffffffffeda,in_stack_fffffffffffffed8)));
      in_RDI->base[-1] = local_ec | 0x10000;
    }
    TVar4 = lj_record_constify((jit_State *)
                               CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8),
                               in_stack_fffffffffffffee0);
    if (TVar4 != 0) {
      return TVar4;
    }
  }
LAB_001a2482:
  uVar6 = uvp_00->dhash + 0xfb3ee249;
  uVar7 = uVar6 * 0x4000 | uVar6 >> 0x12;
  iVar3 = (uVar6 ^ uvp_00->dhash) - uVar7;
  uVar2 = (ushort)(in_ESI << 8) |
          ((ushort)iVar3 ^ ((ushort)(uVar7 << 5) | (ushort)(uVar6 * 0x4000 >> 0x1b))) -
          (ushort)((uint)iVar3 >> 0x13) & 0xff;
  if (uvp_00->closed == '\0') {
    (in_RDI->fold).ins.field_0.ot = 0x3c85;
    (in_RDI->fold).ins.field_0.op1 = (IRRef1)local_ec;
    (in_RDI->fold).ins.field_0.op2 = uVar2;
    TVar4 = lj_opt_fold((jit_State *)
                        CONCAT44(in_stack_fffffffffffffedc,
                                 CONCAT22(in_stack_fffffffffffffeda,in_stack_fffffffffffffed8)));
    IVar9 = (IRRef1)TVar4;
    if ((((in_RDI->L->stack).ptr32 <= (uvp_00->v).ptr32) &&
        ((uvp_00->v).ptr32 < (in_RDI->L->maxstack).ptr32)) &&
       (iVar3 = (int)((long)((ulong)(uvp_00->v).ptr32 -
                            (long)(in_RDI->L->base + -(ulong)in_RDI->baseslot)) >> 3), -1 < iVar3))
    {
      pjVar8 = in_RDI;
      pjVar10 = in_RDI;
      TVar4 = lj_ir_kint(in_RDI,in_stack_fffffffffffffedc);
      (pjVar8->fold).ins.field_0.ot = 0x2905;
      (pjVar8->fold).ins.field_0.op1 = IVar9;
      (pjVar8->fold).ins.field_0.op2 = (IRRef1)TVar4;
      TVar4 = lj_opt_fold((jit_State *)
                          CONCAT44(in_stack_fffffffffffffedc,
                                   CONCAT22(in_stack_fffffffffffffeda,in_stack_fffffffffffffed8)));
      (pjVar10->fold).ins.field_0.ot = 0x885;
      (pjVar10->fold).ins.field_0.op1 = 0x8000;
      (pjVar10->fold).ins.field_0.op2 = (IRRef1)TVar4;
      lj_opt_fold((jit_State *)
                  CONCAT44(in_stack_fffffffffffffedc,
                           CONCAT22(in_stack_fffffffffffffeda,in_stack_fffffffffffffed8)));
      iVar3 = iVar3 - in_RDI->baseslot;
      if (in_EDX != 0) {
        in_RDI->base[iVar3] = in_EDX;
        if ((int)in_RDI->maxslot <= iVar3) {
          in_RDI->maxslot = iVar3 + 1;
        }
        return 0;
      }
      if (in_RDI->base[iVar3] != 0) {
        return in_RDI->base[iVar3];
      }
      TVar4 = sload(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
      return TVar4;
    }
    (in_RDI->fold).ins.field_0.ot = 0x2a05;
    (in_RDI->fold).ins.field_0.op1 = IVar9;
    (in_RDI->fold).ins.field_0.op2 = 0x8000;
    pjVar8 = in_RDI;
    TVar4 = lj_opt_fold((jit_State *)
                        CONCAT44(in_stack_fffffffffffffedc,
                                 CONCAT22(in_stack_fffffffffffffeda,in_stack_fffffffffffffed8)));
    in_stack_fffffffffffffeda = (IRRef1)TVar4;
    TVar4 = lj_ir_kint((jit_State *)&in_stack_fffffffffffffee0->field_2,in_stack_fffffffffffffedc);
    (pjVar8->fold).ins.field_0.ot = 0x785;
    (pjVar8->fold).ins.field_0.op1 = in_stack_fffffffffffffeda;
    (pjVar8->fold).ins.field_0.op2 = (IRRef1)TVar4;
    lj_opt_fold((jit_State *)
                CONCAT44(in_stack_fffffffffffffedc,
                         CONCAT22(in_stack_fffffffffffffeda,in_stack_fffffffffffffed8)));
  }
  else {
    bVar1 = true;
    (in_RDI->fold).ins.field_0.ot = 0x3d85;
    (in_RDI->fold).ins.field_0.op1 = (IRRef1)local_ec;
    (in_RDI->fold).ins.field_0.op2 = uVar2;
    TVar4 = lj_opt_fold((jit_State *)
                        CONCAT44(in_stack_fffffffffffffedc,
                                 CONCAT22(in_stack_fffffffffffffeda,in_stack_fffffffffffffed8)));
    IVar9 = (IRRef1)TVar4;
  }
  if (in_EDX == 0) {
    uVar5 = (ulong)(uvp_00->v).ptr32;
    if (*(uint *)(uVar5 + 4) < 0xfffeffff) {
      local_c = 0xe;
    }
    else if (*(int *)(uVar5 + 4) >> 0xf == -2) {
      local_c = 3;
    }
    else {
      local_c = *(uint *)(uVar5 + 4) ^ 0xffffffff;
    }
    (in_RDI->fold).ins.field_0.ot = (ushort)local_c | 0x4380;
    (in_RDI->fold).ins.field_0.op1 = IVar9;
    (in_RDI->fold).ins.field_0.op2 = 0;
    local_108 = lj_opt_fold((jit_State *)
                            CONCAT44(in_stack_fffffffffffffedc,
                                     CONCAT22(in_stack_fffffffffffffeda,in_stack_fffffffffffffed8)))
    ;
    if (local_c < 3) {
      local_108 = local_c * 0xffffff + 0x7fff;
    }
    local_cc = local_108;
  }
  else {
    local_e0 = in_EDX;
    if ((in_EDX >> 0x18 & 0x1f) - 0xf < 5) {
      (in_RDI->fold).ins.field_0.ot = 0x590e;
      (in_RDI->fold).ins.field_0.op1 = (IRRef1)in_EDX;
      (in_RDI->fold).ins.field_0.op2 = 0x1d3;
      local_e0 = lj_opt_fold((jit_State *)
                             CONCAT44(in_stack_fffffffffffffedc,
                                      CONCAT22(in_stack_fffffffffffffeda,in_stack_fffffffffffffed8))
                            );
    }
    (in_RDI->fold).ins.field_0.ot = (byte)(local_e0 >> 0x18) & 0x1f | 0x4a00;
    (in_RDI->fold).ins.field_0.op1 = IVar9;
    (in_RDI->fold).ins.field_0.op2 = (IRRef1)local_e0;
    lj_opt_fold((jit_State *)
                CONCAT44(in_stack_fffffffffffffedc,
                         CONCAT22(in_stack_fffffffffffffeda,in_stack_fffffffffffffed8)));
    if ((bVar1) && ((local_e0 >> 0x18 & 0x1f) - 4 < 9)) {
      (in_RDI->fold).ins.field_0.ot = 0x5700;
      (in_RDI->fold).ins.field_0.op1 = IVar9;
      (in_RDI->fold).ins.field_0.op2 = (IRRef1)local_e0;
      lj_opt_fold((jit_State *)
                  CONCAT44(in_stack_fffffffffffffedc,
                           CONCAT22(in_stack_fffffffffffffeda,in_stack_fffffffffffffed8)));
    }
    in_RDI->needsnap = '\x01';
    local_cc = 0;
  }
  return local_cc;
}

Assistant:

static TRef rec_upvalue(jit_State *J, uint32_t uv, TRef val)
{
  GCupval *uvp = &gcref(J->fn->l.uvptr[uv])->uv;
  TRef fn = getcurrf(J);
  IRRef uref;
  int needbarrier = 0;
  if (rec_upvalue_constify(J, uvp)) {  /* Try to constify immutable upvalue. */
    TRef tr, kfunc;
    lj_assertJ(val == 0, "bad usage");
    if (!tref_isk(fn)) {  /* Late specialization of current function. */
      if (J->pt->flags >= PROTO_CLC_POLY)
	goto noconstify;
      kfunc = lj_ir_kfunc(J, J->fn);
      emitir(IRTG(IR_EQ, IRT_FUNC), fn, kfunc);
#if LJ_FR2
      J->base[-2] = kfunc;
#else
      J->base[-1] = kfunc | TREF_FRAME;
#endif
      fn = kfunc;
    }
    tr = lj_record_constify(J, uvval(uvp));
    if (tr)
      return tr;
  }
noconstify:
  /* Note: this effectively limits LJ_MAX_UPVAL to 127. */
  uv = (uv << 8) | (hashrot(uvp->dhash, uvp->dhash + HASH_BIAS) & 0xff);
  if (!uvp->closed) {
    uref = tref_ref(emitir(IRTG(IR_UREFO, IRT_PGC), fn, uv));
    /* In current stack? */
    if (uvval(uvp) >= tvref(J->L->stack) &&
	uvval(uvp) < tvref(J->L->maxstack)) {
      int32_t slot = (int32_t)(uvval(uvp) - (J->L->base - J->baseslot));
      if (slot >= 0) {  /* Aliases an SSA slot? */
	emitir(IRTG(IR_EQ, IRT_PGC),
	       REF_BASE,
	       emitir(IRT(IR_ADD, IRT_PGC), uref,
		      lj_ir_kint(J, (slot - 1 - LJ_FR2) * -8)));
	slot -= (int32_t)J->baseslot;  /* Note: slot number may be negative! */
	if (val == 0) {
	  return getslot(J, slot);
	} else {
	  J->base[slot] = val;
	  if (slot >= (int32_t)J->maxslot) J->maxslot = (BCReg)(slot+1);
	  return 0;
	}
      }
    }
    emitir(IRTG(IR_UGT, IRT_PGC),
	   emitir(IRT(IR_SUB, IRT_PGC), uref, REF_BASE),
	   lj_ir_kint(J, (J->baseslot + J->maxslot) * 8));
  } else {
    needbarrier = 1;
    uref = tref_ref(emitir(IRTG(IR_UREFC, IRT_PGC), fn, uv));
  }
  if (val == 0) {  /* Upvalue load */
    IRType t = itype2irt(uvval(uvp));
    TRef res = emitir(IRTG(IR_ULOAD, t), uref, 0);
    if (irtype_ispri(t)) res = TREF_PRI(t);  /* Canonicalize primitive refs. */
    return res;
  } else {  /* Upvalue store. */
    /* Convert int to number before storing. */
    if (!LJ_DUALNUM && tref_isinteger(val))
      val = emitir(IRTN(IR_CONV), val, IRCONV_NUM_INT);
    emitir(IRT(IR_USTORE, tref_type(val)), uref, val);
    if (needbarrier && tref_isgcv(val))
      emitir(IRT(IR_OBAR, IRT_NIL), uref, val);
    J->needsnap = 1;
    return 0;
  }
}